

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

int ShInitialize(void)

{
  int iVar1;
  TPoolAllocator *this;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::init_lock);
  if (iVar1 == 0) {
    (anonymous_namespace)::NumberOfClients = (anonymous_namespace)::NumberOfClients + 1;
    if ((anonymous_namespace)::PerProcessGPA == (TPoolAllocator *)0x0) {
      this = (TPoolAllocator *)operator_new(0x60);
      glslang::TPoolAllocator::TPoolAllocator(this,0x2000,0x10);
      (anonymous_namespace)::PerProcessGPA = this;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::init_lock);
    return 1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int ShInitialize()
{
#ifndef DISABLE_THREAD_SUPPORT
    const std::lock_guard<std::mutex> lock(init_lock);
#endif
    ++NumberOfClients;

    if (PerProcessGPA == nullptr)
        PerProcessGPA = new TPoolAllocator();

    return 1;
}